

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

StructReader * __thiscall
capnp::_::PointerReader::getStruct
          (StructReader *__return_storage_ptr__,PointerReader *this,word *defaultValue)

{
  ushort uVar1;
  unsigned_short uVar2;
  word *pwVar3;
  CapTableReader *pCVar4;
  Arena *pAVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar9;
  char *pcVar10;
  WirePointer *pWVar11;
  long lVar12;
  WirePointer *pWVar13;
  WirePointer *pWVar14;
  char *pcVar15;
  DebugComparison<int_&,_int> *this_00;
  Exception *local_78;
  int local_6c;
  DebugComparison<int_&,_int> _kjCondition;
  Fault f;
  Fault f_3;
  
  pWVar13 = (WirePointer *)&(anonymous_namespace)::zero;
  if (this->pointer != (WirePointer *)0x0) {
    pWVar13 = this->pointer;
  }
  local_78 = (Exception *)this->segment;
  local_6c = this->nestingLimit;
  pWVar14 = pWVar13 + 1;
  iVar7 = (int)*(uint64_t *)&(pWVar13->offsetAndKind).value;
  lVar12 = (long)(iVar7 >> 2);
  if (local_78 == (Exception *)0x0) {
    pWVar11 = pWVar14 + lVar12;
  }
  else {
    pwVar3 = ((ArrayPtr<const_capnp::word> *)&(local_78->ownFile).content.disposer)->ptr;
    pWVar11 = (WirePointer *)(pwVar3 + (long)local_78->file);
    if (((long)pwVar3 - (long)pWVar14 >> 3 <= lVar12) &&
       (lVar12 <= (long)pWVar11 - (long)pWVar14 >> 3)) {
      pWVar11 = pWVar14 + lVar12;
    }
  }
  pCVar4 = this->capTable;
  if (iVar7 != 0 || (pWVar13->field_1).upper32Bits != 0) goto LAB_00188273;
LAB_0018823a:
  do {
    pWVar13 = (WirePointer *)defaultValue;
    if ((pWVar13 == (WirePointer *)0x0) ||
       (iVar7 = (int)*(uint64_t *)&(pWVar13->offsetAndKind).value,
       (pWVar13->field_1).upper32Bits == 0 && iVar7 == 0)) {
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->pointers = (WirePointer *)0x0;
      __return_storage_ptr__->segment = (SegmentReader *)0x0;
      __return_storage_ptr__->capTable = (CapTableReader *)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->pointers + 6) = 0;
      __return_storage_ptr__->nestingLimit = 0x7fffffff;
      return __return_storage_ptr__;
    }
    local_78 = (Exception *)0x0;
    pWVar11 = pWVar13 + (long)(iVar7 >> 2) + 1;
    defaultValue = (word *)0x0;
LAB_00188273:
    _kjCondition.left = &local_6c;
    _kjCondition._8_8_ = (ulong)(uint)_kjCondition._12_4_ << 0x20;
    _kjCondition.op.content.ptr = " > ";
    _kjCondition.op.content.size_ = 4;
    _kjCondition.result = 0 < local_6c;
    if (local_6c < 1) {
      this_00 = (DebugComparison<int_&,_int> *)&f;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[76]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x88b,FAILED,"nestingLimit > 0",
                 "_kjCondition,\"Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.\""
                 ,&_kjCondition,
                 (char (*) [76])
                 "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.");
      goto LAB_00188681;
    }
    pWVar14 = pWVar13;
    if ((local_78 == (Exception *)0x0) || ((*(uint64_t *)&(pWVar13->offsetAndKind).value & 3) != 2))
    goto LAB_001885a3;
    pAVar5 = (Arena *)(local_78->ownFile).content.ptr;
    iVar7 = (*pAVar5->_vptr_Arena[2])(pAVar5,(ulong)(pWVar13->field_1).upper32Bits);
    local_78 = (Exception *)CONCAT44(extraout_var,iVar7);
    _kjCondition.right = 0;
    _kjCondition._12_4_ = 0;
    _kjCondition.op.content.ptr = " != ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = local_78 != (Exception *)0x0;
    if (local_78 == (Exception *)0x0) {
      this_00 = (DebugComparison<int_&,_int> *)&f;
      _kjCondition.left = (int *)&local_78;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x244,FAILED,"segment != nullptr",
                 "_kjCondition,\"Message contains far pointer to unknown segment.\"",
                 (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&_kjCondition,
                 (char (*) [49])"Message contains far pointer to unknown segment.");
      goto LAB_00188681;
    }
    uVar8 = (uint)*(uint64_t *)&(pWVar13->offsetAndKind).value;
    pcVar15 = (char *)(ulong)(uVar8 >> 3);
    pcVar10 = local_78->file;
    if ((long)pcVar10 < (long)pcVar15) {
      pcVar15 = pcVar10;
    }
    uVar9 = 2 - (ulong)((uVar8 & 4) == 0);
    _kjCondition.left = (int *)&local_78;
    if (pcVar10 < pcVar15 + uVar9) {
LAB_00188336:
      f.exception = f.exception & 0xffffffffffffff00;
      this_00 = &_kjCondition;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                 "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                 ,(DebugExpression<bool> *)&f,
                 (char (*) [318])
                 "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                );
      goto LAB_00188681;
    }
    pWVar14 = (WirePointer *)
              (((ArrayPtr<const_capnp::word> *)&(local_78->ownFile).content.disposer)->ptr +
              (long)pcVar15);
    uVar6 = (*(ReadLimiter **)&local_78->line)->limit;
    if (uVar6 < uVar9) {
      _kjCondition.left = (int *)&local_78;
      (*((Arena *)(local_78->ownFile).content.ptr)->_vptr_Arena[3])();
      goto LAB_00188336;
    }
    (*(ReadLimiter **)&local_78->line)->limit = uVar6 - uVar9;
    if ((*(uint64_t *)&(pWVar13->offsetAndKind).value & 4) == 0) {
      pWVar13 = pWVar14 + 1;
      uVar8 = (uint)*(uint64_t *)&(pWVar14->offsetAndKind).value;
      lVar12 = (long)((int)uVar8 >> 2);
      if ((local_78 != (Exception *)0x0) &&
         ((pwVar3 = ((ArrayPtr<const_capnp::word> *)&(local_78->ownFile).content.disposer)->ptr,
          pWVar11 = (WirePointer *)(pwVar3 + (long)local_78->file),
          lVar12 < (long)pwVar3 - (long)pWVar13 >> 3 ||
          ((long)pWVar11 - (long)pWVar13 >> 3 < lVar12)))) goto LAB_001885a3;
      pWVar11 = pWVar13 + lVar12;
      goto LAB_001885b3;
    }
    pAVar5 = (Arena *)(local_78->ownFile).content.ptr;
    _kjCondition.left = (int *)&local_78;
    iVar7 = (*pAVar5->_vptr_Arena[2])(pAVar5,(ulong)(pWVar14->field_1).upper32Bits);
    f.exception = (Exception *)CONCAT44(extraout_var_00,iVar7);
    _kjCondition.left = (int *)&f;
    _kjCondition.right = 0;
    _kjCondition._12_4_ = 0;
    _kjCondition.op.content.ptr = " != ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = f.exception != (Exception *)0x0;
    if (f.exception == (Exception *)0x0) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                (&f_3,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x25f,FAILED,"newSegment != nullptr",
                 "_kjCondition,\"Message contains double-far pointer to unknown segment.\"",
                 (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&_kjCondition,
                 (char (*) [56])"Message contains double-far pointer to unknown segment.");
    }
    else {
      uVar8 = (uint)*(uint64_t *)&(pWVar14->offsetAndKind).value & 3;
      _kjCondition.left = (int *)CONCAT44(2,uVar8);
      _kjCondition._8_8_ = anon_var_dwarf_48971;
      _kjCondition.op.content.ptr = (char *)0x5;
      _kjCondition.op.content.size_ = (size_t)(uVar8 == 2);
      if (uVar8 == 2) {
        pcVar10 = (char *)(ulong)((uint)*(uint64_t *)&(pWVar14->offsetAndKind).value >> 3);
        if ((long)(f.exception)->file < (long)pcVar10) {
          pcVar10 = (f.exception)->file;
        }
        pWVar11 = (WirePointer *)
                  (((ArrayPtr<const_capnp::word> *)&((f.exception)->ownFile).content.disposer)->ptr
                  + (long)pcVar10);
        pWVar14 = pWVar14 + 1;
        local_78 = f.exception;
        goto LAB_001885a3;
      }
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                (&f_3,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                 "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                 (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                 &_kjCondition,(char (*) [51])"Second word of double-far pad must be far pointer.");
    }
    pWVar11 = (WirePointer *)0x0;
    kj::_::Debug::Fault::~Fault(&f_3);
    pWVar14 = pWVar14 + 1;
LAB_001885a3:
  } while (pWVar11 == (WirePointer *)0x0);
  uVar8 = (uint)*(uint64_t *)&(pWVar14->offsetAndKind).value;
LAB_001885b3:
  uVar8 = uVar8 & 3;
  _kjCondition.left = (int *)(ulong)uVar8;
  _kjCondition._8_8_ = anon_var_dwarf_48971;
  _kjCondition.op.content.ptr = (char *)0x5;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar8 == 0);
  if (uVar8 == 0) {
    if (local_78 == (Exception *)0x0) {
      local_78 = (Exception *)0x0;
LAB_001886a8:
      uVar1 = *(ushort *)&pWVar14->field_1;
      uVar2 = (pWVar14->field_1).structRef.ptrCount.value;
      __return_storage_ptr__->segment = (SegmentReader *)local_78;
      __return_storage_ptr__->capTable = pCVar4;
      __return_storage_ptr__->data = pWVar11;
      __return_storage_ptr__->pointers = pWVar11 + uVar1;
      __return_storage_ptr__->dataSize = (uint)uVar1 << 6;
      __return_storage_ptr__->pointerCount = uVar2;
      __return_storage_ptr__->nestingLimit = local_6c + -1;
      return __return_storage_ptr__;
    }
    uVar9 = (ulong)(pWVar14->field_1).structRef.dataSize.value +
            (ulong)(pWVar14->field_1).structRef.ptrCount.value;
    if ((char *)(((long)pWVar11 -
                  (long)((ArrayPtr<const_capnp::word> *)&(local_78->ownFile).content.disposer)->ptr
                 >> 3) + uVar9) <= local_78->file) {
      uVar6 = (*(ReadLimiter **)&local_78->line)->limit;
      if (uVar9 <= uVar6) {
        (*(ReadLimiter **)&local_78->line)->limit = uVar6 - uVar9;
        goto LAB_001886a8;
      }
      (*((Arena *)(local_78->ownFile).content.ptr)->_vptr_Arena[3])();
    }
    f.exception = f.exception & 0xffffffffffffff00;
    this_00 = &_kjCondition;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[322]>
              ((Fault *)this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x89e,FAILED,"boundsCheck(segment, ptr, ref->structRef.wordSize())",
               "_kjCondition,\"Message contained out-of-bounds struct pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
               ,(DebugExpression<bool> *)&f,
               (char (*) [322])
               "Message contained out-of-bounds struct pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
              );
  }
  else {
    this_00 = (DebugComparison<int_&,_int> *)&f;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[87]>
              ((Fault *)this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x898,FAILED,"ref->kind() == WirePointer::STRUCT",
               "_kjCondition,\"Schema mismatch: Message contains non-struct pointer where struct pointer\" \"was expected.\""
               ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                &_kjCondition,
               (char (*) [87])
               "Schema mismatch: Message contains non-struct pointer where struct pointerwas expected."
              );
  }
LAB_00188681:
  kj::_::Debug::Fault::~Fault((Fault *)this_00);
  goto LAB_0018823a;
}

Assistant:

StructReader PointerReader::getStruct(const word* defaultValue) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readStructPointer(segment, capTable, ref, defaultValue, nestingLimit);
}